

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalCSE.cpp
# Opt level: O3

void __thiscall wasm::anon_unknown_166::RequestInfo::validate(RequestInfo *this)

{
  long in_RSI;
  
  if (in_RSI != 0 && (int)this != 0) {
    __assert_fail("!(requests && original)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/LocalCSE.cpp"
                  ,0xba,"void wasm::(anonymous namespace)::RequestInfo::validate() const");
  }
  if ((int)this != 0 || in_RSI != 0) {
    return;
  }
  __assert_fail("requests || original",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/LocalCSE.cpp"
                ,0xbf,"void wasm::(anonymous namespace)::RequestInfo::validate() const");
}

Assistant:

void validate() const {
    // An expression cannot both be requested and make requests. If we see A
    // appear three times, both repeats must request from the very first.
    assert(!(requests && original));

    // When we encounter a requestInfo (after its initial creation) then it
    // must either request or be requested - otherwise, it should not exist,
    // as we remove unneeded things from our tracking.
    assert(requests || original);
  }